

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  SpecialProperties SVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string local_148;
  ReusableStringStream local_128;
  string _descOrTags;
  string desc;
  TestCaseInfo info;
  
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  desc._M_dataplus._M_p = (pointer)&desc.field_2;
  desc._M_string_length = 0;
  desc.field_2._M_local_buf[0] = '\0';
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tag.field_2._M_local_buf[0] = '\0';
  StringRef::operator_cast_to_string(&_descOrTags,&nameAndTags->tags);
  sVar5 = 0;
  bVar4 = false;
  bVar3 = false;
  do {
    if (_descOrTags._M_string_length == sVar5) {
      if (bVar3) {
        std::__cxx11::string::string((string *)&info,".",(allocator *)&local_148);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tags,
                   &info.name);
        std::__cxx11::string::~string((string *)&info);
      }
      StringRef::operator_cast_to_string(&local_148,&nameAndTags->name);
      TestCaseInfo::TestCaseInfo(&info,&local_148,_className,&desc,&tags,_lineInfo);
      std::__cxx11::string::~string((string *)&local_148);
      TestCase::TestCase(__return_storage_ptr__,_testCase,&info);
      TestCaseInfo::~TestCaseInfo(&info);
      std::__cxx11::string::~string((string *)&_descOrTags);
      std::__cxx11::string::~string((string *)&tag);
      std::__cxx11::string::~string((string *)&desc);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tags);
      return __return_storage_ptr__;
    }
    if (bVar4) {
      if (_descOrTags._M_dataplus._M_p[sVar5] == ']') {
        SVar1 = anon_unknown_1::parseSpecialTag(&tag);
        bVar4 = true;
        if (((((SVar1 & IsHidden) == None) && (bVar4 = bVar3, SVar1 == None)) &&
            (SVar1 = anon_unknown_1::parseSpecialTag(&tag),
            tag._M_string_length != 0 && SVar1 == None)) &&
           (iVar2 = isalnum((uint)(byte)*tag._M_dataplus._M_p), iVar2 == 0)) {
          ReusableStringStream::ReusableStringStream(&local_128);
          std::operator<<((ostream *)local_128.m_oss,"Tag name: [");
          std::operator<<((ostream *)local_128.m_oss,(string *)&tag);
          std::operator<<((ostream *)local_128.m_oss,"] is not allowed.\n");
          std::operator<<((ostream *)local_128.m_oss,
                          "Tag names starting with non alphanumeric characters are reserved\n");
          operator<<(local_128.m_oss,_lineInfo);
          std::__cxx11::stringbuf::str();
          std::domain_error::domain_error((domain_error *)&local_148,(string *)&info);
          throw_exception<std::domain_error>((domain_error *)&local_148);
        }
        bVar3 = bVar4;
        if (((tag._M_string_length != 0) && (tag._M_string_length != 1)) &&
           (*tag._M_dataplus._M_p == '.')) {
          std::__cxx11::string::erase((ulong)&tag,0);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tags,&tag);
        tag._M_string_length = 0;
        *tag._M_dataplus._M_p = '\0';
LAB_0011fde4:
        bVar4 = false;
      }
      else {
        bVar4 = true;
        std::__cxx11::string::push_back((char)&tag);
      }
    }
    else {
      bVar4 = true;
      if (_descOrTags._M_dataplus._M_p[sVar5] != '[') {
        std::__cxx11::string::push_back((char)&desc);
        goto LAB_0011fde4;
      }
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        std::string _descOrTags = nameAndTags.tags;
        for (char c : _descOrTags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.push_back( "." );
        }

        TestCaseInfo info( nameAndTags.name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }